

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  BYTE BVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  size_t err_code_2;
  size_t sVar8;
  XXH64_hash_t XVar9;
  ulong uVar10;
  code *pcVar11;
  uint *puVar12;
  ulong uVar13;
  size_t sVar14;
  size_t err_code_1;
  ulong uVar15;
  bool bVar16;
  BYTE *op;
  ulong local_d0;
  ulong local_b8;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1a94,
                  "size_t ZSTD_compressSequences(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  sVar8 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  iVar7 = 0x1bd0a9;
  sVar8 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
  if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
    iVar7 = 0x1bd0d1;
    ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
  }
  local_48 = 0;
  uStack_40 = 0;
  ZVar2 = (cctx->appliedParams).blockDelimiters;
  if (ZSTD_sf_explicitBlockDelimiters < ZVar2) {
    __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x19cf,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)");
  }
  op = (BYTE *)((long)dst + sVar8);
  uVar15 = dstCapacity - sVar8;
  pcVar11 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
  if ((ZVar2 & ZSTD_sf_explicitBlockDelimiters) != ZSTD_sf_noBlockDelimiters) {
    pcVar11 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
  }
  local_d0 = uVar15;
  if (srcSize == 0) {
    if (uVar15 < 4) {
      uVar13 = 0;
    }
    else {
      op[0] = '\x01';
      op[1] = '\0';
      op[2] = '\0';
      op[3] = '\0';
      op = op + 3;
      uVar13 = 3;
      local_d0 = uVar15 - 3;
    }
    local_b8 = 0xffffffffffffffba;
    if (uVar15 < 4) goto LAB_001bd5f1;
  }
  else {
    uVar13 = 0;
  }
  local_b8 = uVar13;
  if (srcSize == 0) {
LAB_001bd5f1:
    sVar14 = local_b8;
    if ((local_b8 < 0xffffffffffffff89) &&
       (sVar8 = sVar8 + local_b8, sVar14 = sVar8, (cctx->appliedParams).fParams.checksumFlag != 0))
    {
      XVar9 = ZSTD_XXH64_digest(&cctx->xxhState);
      sVar14 = 0xffffffffffffffba;
      if (3 < uVar15 - local_b8) {
        *(int *)((long)dst + sVar8) = (int)XVar9;
        sVar14 = sVar8 + 4;
      }
    }
    return sVar14;
  }
  puVar12 = &inSeqs->matchLength;
  uVar15 = cctx->blockSize;
  if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
    uVar13 = uVar15;
    if (srcSize < uVar15) {
      uVar13 = srcSize;
    }
  }
  else {
    uVar10 = 0xffffffffffffff95;
    if (inSeqsSize != 0) {
      uVar13 = 0;
      sVar8 = inSeqsSize;
      do {
        uVar13 = (puVar12[-1] + *puVar12) + uVar13;
        if (((ZSTD_Sequence *)(puVar12 + -2))->offset == 0) {
          uVar10 = uVar13;
          if (*puVar12 != 0) {
            uVar10 = 0xffffffffffffff95;
          }
          break;
        }
        puVar12 = puVar12 + 4;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
    uVar13 = uVar10;
    if (((uVar10 < 0xffffffffffffff89) && (uVar13 = 0xffffffffffffff95, uVar10 <= uVar15)) &&
       (uVar13 = uVar10, srcSize < uVar10)) {
      uVar13 = 0xffffffffffffff95;
    }
  }
  uVar6 = 1;
  if (0xffffffffffffff88 < uVar13) goto LAB_001bd4f5;
  if (srcSize < uVar13) {
    __assert_fail("blockSize <= remaining",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1a33,
                  "size_t ZSTD_compressSequences_internal(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  (cctx->seqStore).lit = (cctx->seqStore).litStart;
  (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
  (cctx->seqStore).longLengthType = ZSTD_llt_none;
  uVar15 = (*pcVar11)(cctx,&local_48,inSeqs,inSeqsSize,src,uVar13,
                      (cctx->appliedParams).searchForExternalRepcodes);
  if (uVar15 < 0xffffffffffffff89) {
    uVar10 = uVar13 - uVar15;
    sVar5 = (short)uVar10;
    if (uVar10 < 7) {
      uVar15 = 0xffffffffffffffba;
      if (uVar10 + 3 <= local_d0) {
        *(ushort *)op = (ushort)(uVar13 == srcSize) + sVar5 * 8;
        op[2] = '\0';
        memcpy(op + 3,src,uVar10);
        uVar15 = uVar10 + 3;
      }
      if (uVar15 < 0xffffffffffffff89) {
        sVar8 = (*(code *)&LAB_001bd500)();
        return sVar8;
      }
    }
    else if (local_d0 < 3) {
      uVar15 = 0xffffffffffffffba;
    }
    else {
      uVar15 = ZSTD_entropyCompressSeqStore
                         (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                          &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,op + 3,
                          local_d0 - 3,uVar10,cctx->entropyWorkspace,(ulong)(uint)cctx->bmi2,iVar7);
      if (uVar15 < 0xffffffffffffff89) {
        if (((cctx->isFirstBlock == 0) &&
            ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart) <
             0x20)) &&
           (((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10 &&
            (iVar7 = ZSTD_isRLE((BYTE *)src,uVar10), iVar7 != 0)))) {
          uVar15 = 1;
        }
        if (uVar15 == 1) {
          if (local_d0 != 3) {
            BVar1 = *src;
            *(ushort *)op = (uVar13 == srcSize) + 2 + sVar5 * 8;
            op[2] = (BYTE)(uVar10 >> 0xd);
            op[3] = BVar1;
          }
          uVar15 = 0xffffffffffffffba;
          if (local_d0 == 3) goto LAB_001bd4f0;
        }
        else if (uVar15 == 0) {
          uVar15 = 0xffffffffffffffba;
          if (uVar10 + 3 <= local_d0) {
            *(ushort *)op = (ushort)(uVar13 == srcSize) + sVar5 * 8;
            op[2] = (BYTE)(uVar10 >> 0xd);
            memcpy(op + 3,src,uVar10);
            uVar15 = uVar10 + 3;
          }
          if (0xffffffffffffff88 < uVar15) goto LAB_001bd4f0;
        }
        else {
          pZVar3 = (cctx->blockState).prevCBlock;
          pZVar4 = (cctx->blockState).nextCBlock;
          (cctx->blockState).prevCBlock = pZVar4;
          (cctx->blockState).nextCBlock = pZVar3;
          if ((pZVar4->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
            (pZVar4->entropy).fse.offcode_repeatMode = FSE_repeat_check;
          }
          *(ushort *)op = (uVar13 == srcSize) + 4 + (short)uVar15 * 8;
          op[2] = (BYTE)(uVar15 >> 0xd);
        }
        uVar6 = 3;
        bVar16 = uVar13 != srcSize;
        uVar13 = 0xffffffffffffffba;
        if (bVar16) {
          cctx->isFirstBlock = 0;
          uVar6 = 0;
        }
        goto LAB_001bd4f5;
      }
    }
  }
LAB_001bd4f0:
  uVar6 = 1;
  uVar13 = uVar15;
LAB_001bd4f5:
  sVar8 = (*(code *)((long)&DAT_00264db8 + (long)(int)(&DAT_00264db8)[uVar6]))(uVar13);
  return sVar8;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}